

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_attribute.cc
# Opt level: O1

int __thiscall
aliyun::Rds::DescribeDBInstanceAttribute
          (Rds *this,RdsDescribeDBInstanceAttributeRequestType *req,
          RdsDescribeDBInstanceAttributeResponseType *response,RdsErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ArrayIndex AVar6;
  Int IVar7;
  char *pcVar8;
  AliRpcRequest *this_00;
  long *plVar9;
  size_t sVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint uVar14;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_878;
  Value local_858;
  int local_840;
  uint local_83c;
  vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
  *local_838;
  value_type local_830;
  long *local_810;
  long local_808;
  long local_800 [2];
  string local_7f0;
  Value *local_7d0;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  undefined1 local_5a8 [32];
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  _Alloc_hider local_568;
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Alloc_hider local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  long local_448;
  Int local_440;
  _Alloc_hider local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  Int local_378;
  Int local_374;
  _Alloc_hider local_370;
  size_type local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  Int local_2f0;
  Int local_2ec;
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  local_7f0._M_string_length = 0;
  local_7f0.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar8 = "https";
  }
  local_810 = local_800;
  local_838 = &response->items;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_810,pcVar8,pcVar8 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_830);
  local_5a8._0_8_ = local_5a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5a8,local_810,local_808 + (long)local_810);
  std::__cxx11::string::append(local_5a8);
  plVar9 = (long *)std::__cxx11::string::append(local_5a8);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_7c8.field_2._M_allocated_capacity = *psVar13;
    local_7c8.field_2._8_8_ = plVar9[3];
    local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  }
  else {
    local_7c8.field_2._M_allocated_capacity = *psVar13;
    local_7c8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_7c8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_7c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
    operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    sVar10 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,pcVar8,pcVar8 + sVar10);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_5c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_858,nullValue);
  Json::Reader::Reader(&local_140);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Action","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_608,"DescribeDBInstanceAttribute","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5e8,&local_608);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"OwnerId","");
    pcVar3 = (req->owner_id)._M_dataplus._M_p;
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_648,pcVar3,pcVar3 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_628,&local_648);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"ResourceOwnerAccount","");
    pcVar3 = (req->resource_owner_account)._M_dataplus._M_p;
    local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_688,pcVar3,pcVar3 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_668,&local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"ResourceOwnerId","");
    pcVar3 = (req->resource_owner_id)._M_dataplus._M_p;
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,pcVar3,pcVar3 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6a8,&local_6c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->client_token)._M_string_length != 0) {
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"ClientToken","");
    pcVar3 = (req->client_token)._M_dataplus._M_p;
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_708,pcVar3,pcVar3 + (req->client_token)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6e8,&local_708);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"DBInstanceId","");
    pcVar3 = (req->db_instance_id)._M_dataplus._M_p;
    local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_748,pcVar3,pcVar3 + (req->db_instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_728,&local_748);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_748._M_dataplus._M_p != &local_748.field_2) {
      operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_728._M_dataplus._M_p != &local_728.field_2) {
      operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"OwnerAccount","");
    pcVar3 = (req->owner_account)._M_dataplus._M_p;
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_788,pcVar3,pcVar3 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_768,&local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_768._M_dataplus._M_p != &local_768.field_2) {
      operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_5a8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7a8,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_7f0);
    if (((0 < iVar5) && (local_7f0._M_string_length != 0)) &&
       (bVar4 = Json::Reader::parse(&local_140,&local_7f0,&local_858,true), bVar4)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar5 != 200) {
        bVar4 = Json::Value::isMember(&local_858,"RequestId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_858,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar11);
        }
        else {
          local_5a8._0_8_ = local_5a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,anon_var_dwarf_581264 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_5a8);
        if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
          operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_858,"Code");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_858,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar11);
        }
        else {
          local_5a8._0_8_ = local_5a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,anon_var_dwarf_581264 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_5a8);
        if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
          operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_858,"HostId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_858,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar11);
        }
        else {
          local_5a8._0_8_ = local_5a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,anon_var_dwarf_581264 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_5a8);
        if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
          operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_858,"Message");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_858,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_5a8,pVVar11);
        }
        else {
          local_5a8._0_8_ = local_5a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,anon_var_dwarf_581264 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_5a8);
        if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
          operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
        }
      }
      if ((local_838 !=
           (vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
            *)0x0 && iVar5 == 200) && (bVar4 = Json::Value::isMember(&local_858,"Items"), bVar4)) {
        pVVar11 = Json::Value::operator[](&local_858,"Items");
        bVar4 = Json::Value::isMember(pVVar11,"DBInstanceAttribute");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_858,"Items");
          pVVar11 = Json::Value::operator[](pVVar11,"DBInstanceAttribute");
          bVar4 = Json::Value::isArray(pVVar11);
          if ((bVar4) && (AVar6 = Json::Value::size(pVVar11), AVar6 != 0)) {
            paVar1 = &local_878.field_2;
            paVar2 = &local_830.db_instance_id.field_2;
            uVar14 = 0;
            local_840 = iVar5;
            local_7d0 = pVVar11;
            do {
              local_5a8._0_8_ = (pointer)0x0;
              local_5a8._8_8_ = (pointer)0x0;
              local_5a8._16_8_ = 0;
              local_588._M_p = (pointer)&local_578;
              local_580 = 0;
              local_578._M_local_buf[0] = '\0';
              local_568._M_p = (pointer)&local_558;
              local_560 = 0;
              local_558._M_local_buf[0] = '\0';
              local_548._M_p = (pointer)&local_538;
              local_540 = 0;
              local_538._M_local_buf[0] = '\0';
              local_528._M_p = (pointer)&local_518;
              local_520 = 0;
              local_518._M_local_buf[0] = '\0';
              local_508._M_p = (pointer)&local_4f8;
              local_500 = 0;
              local_4f8._M_local_buf[0] = '\0';
              local_4e8._M_p = (pointer)&local_4d8;
              local_4e0 = 0;
              local_4d8._M_local_buf[0] = '\0';
              local_4c8._M_p = (pointer)&local_4b8;
              local_4c0 = 0;
              local_4b8._M_local_buf[0] = '\0';
              local_4a8._M_p = (pointer)&local_498;
              local_4a0 = 0;
              local_498._M_local_buf[0] = '\0';
              local_488._M_p = (pointer)&local_478;
              local_480 = 0;
              local_478._M_local_buf[0] = '\0';
              local_468._M_p = (pointer)&local_458;
              local_460 = 0;
              local_458._M_local_buf[0] = '\0';
              local_438._M_p = (pointer)&local_428;
              local_430 = 0;
              local_428._M_local_buf[0] = '\0';
              local_418._M_p = (pointer)&local_408;
              local_410 = 0;
              local_408._M_local_buf[0] = '\0';
              local_3f8._M_p = (pointer)&local_3e8;
              local_3f0 = 0;
              local_3e8._M_local_buf[0] = '\0';
              local_3d8._M_p = (pointer)&local_3c8;
              local_3d0 = 0;
              local_3c8._M_local_buf[0] = '\0';
              local_3b8._M_p = (pointer)&local_3a8;
              local_3b0 = 0;
              local_3a8._M_local_buf[0] = '\0';
              local_398._M_p = (pointer)&local_388;
              local_390 = 0;
              local_388._M_local_buf[0] = '\0';
              local_370._M_p = (pointer)&local_360;
              local_368 = 0;
              local_360._M_local_buf[0] = '\0';
              local_350._M_p = (pointer)&local_340;
              local_348 = 0;
              local_340._M_local_buf[0] = '\0';
              local_330._M_p = (pointer)&local_320;
              local_328 = 0;
              local_320._M_local_buf[0] = '\0';
              local_310._M_p = (pointer)&local_300;
              local_308 = 0;
              local_300._M_local_buf[0] = '\0';
              local_2e8._M_p = (pointer)&local_2d8;
              local_2e0 = 0;
              local_2d8._M_local_buf[0] = '\0';
              local_2c8._M_p = (pointer)&local_2b8;
              local_2c0 = 0;
              local_2b8._M_local_buf[0] = '\0';
              local_2a8._M_p = (pointer)&local_298;
              local_2a0 = 0;
              local_298._M_local_buf[0] = '\0';
              local_288._M_p = (pointer)&local_278;
              local_280 = 0;
              local_278._M_local_buf[0] = '\0';
              local_268._M_p = (pointer)&local_258;
              local_260 = 0;
              local_258._M_local_buf[0] = '\0';
              local_248._M_p = (pointer)&local_238;
              local_240 = 0;
              local_238._M_local_buf[0] = '\0';
              local_228._M_p = (pointer)&local_218;
              local_220 = 0;
              local_218._M_local_buf[0] = '\0';
              local_208._M_p = (pointer)&local_1f8;
              local_200 = 0;
              local_1f8._M_local_buf[0] = '\0';
              local_1e8._M_p = (pointer)&local_1d8;
              local_1e0 = 0;
              local_1d8._M_local_buf[0] = '\0';
              local_83c = uVar14;
              pVVar11 = Json::Value::operator[](pVVar11,uVar14);
              bVar4 = Json::Value::isMember(pVVar11,"InsId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"InsId");
                local_5a8._24_4_ = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_588,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"PayType");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"PayType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_568,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceClassType");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceClassType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_548,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceType");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_528,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"RegionId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"RegionId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_508,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ConnectionString");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ConnectionString");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"Port");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"Port");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"Engine");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"Engine");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"EngineVersion");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"EngineVersion");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_488,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceClass");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceClass");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_468,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceMemory");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceMemory");
                IVar7 = Json::Value::asInt(pVVar12);
                local_448 = (long)IVar7;
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceStorage");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceStorage");
                local_440 = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceNetType");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceNetType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_438,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceStatus");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceStatus");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_418,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBInstanceDescription");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBInstanceDescription");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_3f8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"LockMode");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"LockMode");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_3d8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"LockReason");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"LockReason");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ReadDelayTime");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ReadDelayTime");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_398,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"DBMaxQuantity");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"DBMaxQuantity");
                local_378 = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"AccountMaxQuantity");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"AccountMaxQuantity");
                local_374 = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"CreationTime");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"CreationTime");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_370,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ExpireTime");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ExpireTime");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_350,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"MaintainTime");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"MaintainTime");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_330,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"AvailabilityValue");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"AvailabilityValue");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_310,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"MaxIOPS");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"MaxIOPS");
                local_2f0 = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"MaxConnections");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"MaxConnections");
                local_2ec = Json::Value::asInt(pVVar12);
              }
              bVar4 = Json::Value::isMember(pVVar11,"MasterInstanceId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"MasterInstanceId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"IncrementSourceDBInstanceId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"IncrementSourceDBInstanceId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"GuardDBInstanceId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"GuardDBInstanceId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"TempDBInstanceId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"TempDBInstanceId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_288,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"SecurityIPList");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"SecurityIPList");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_268,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ZoneId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ZoneId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_248,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"InstanceNetworkType");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"InstanceNetworkType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_228,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"VpcId");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"VpcId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_208,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ConnectionMode");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ConnectionMode");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != paVar1) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = Json::Value::isMember(pVVar11,"ReadOnlyDBInstanceIds");
              if (bVar4) {
                pVVar12 = Json::Value::operator[](pVVar11,"ReadOnlyDBInstanceIds");
                bVar4 = Json::Value::isMember(pVVar12,"ReadOnlyDBInstanceId");
                if (bVar4) {
                  pVVar11 = Json::Value::operator[](pVVar11,"ReadOnlyDBInstanceIds");
                  pVVar11 = Json::Value::operator[](pVVar11,"ReadOnlyDBInstanceId");
                  bVar4 = Json::Value::isArray(pVVar11);
                  if ((bVar4) && (AVar6 = Json::Value::size(pVVar11), AVar6 != 0)) {
                    uVar14 = 0;
                    do {
                      local_830.db_instance_id._M_string_length = 0;
                      local_830.db_instance_id.field_2._M_local_buf[0] = '\0';
                      local_830.db_instance_id._M_dataplus._M_p = (pointer)paVar2;
                      pVVar12 = Json::Value::operator[](pVVar11,uVar14);
                      bVar4 = Json::Value::isMember(pVVar12,"DBInstanceId");
                      if (bVar4) {
                        pVVar12 = Json::Value::operator[](pVVar12,"DBInstanceId");
                        Json::Value::asString_abi_cxx11_(&local_878,pVVar12);
                        std::__cxx11::string::operator=((string *)&local_830,(string *)&local_878);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_878._M_dataplus._M_p != paVar1) {
                          operator_delete(local_878._M_dataplus._M_p,
                                          local_878.field_2._M_allocated_capacity + 1);
                        }
                      }
                      std::
                      vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
                      ::push_back((vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
                                   *)local_5a8,&local_830);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_830.db_instance_id._M_dataplus._M_p != paVar2) {
                        operator_delete(local_830.db_instance_id._M_dataplus._M_p,
                                        CONCAT71(local_830.db_instance_id.field_2.
                                                 _M_allocated_capacity._1_7_,
                                                 local_830.db_instance_id.field_2._M_local_buf[0]) +
                                        1);
                      }
                      AVar6 = Json::Value::size(pVVar11);
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < AVar6);
                  }
                }
              }
              std::
              vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
              ::push_back(local_838,(value_type *)local_5a8);
              RdsDescribeDBInstanceAttributeDBInstanceAttributeType::
              ~RdsDescribeDBInstanceAttributeDBInstanceAttributeType
                        ((RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)local_5a8);
              pVVar11 = local_7d0;
              AVar6 = Json::Value::size(local_7d0);
              uVar14 = local_83c + 1;
              iVar5 = local_840;
            } while (uVar14 < AVar6);
          }
        }
      }
      goto LAB_00168bda;
    }
    if (error_info == (RdsErrorInfo *)0x0) goto LAB_00168bd5;
    pcVar8 = "parse response failed";
  }
  else {
    if (error_info == (RdsErrorInfo *)0x0) {
LAB_00168bd5:
      iVar5 = -1;
      goto LAB_00168bda;
    }
    pcVar8 = "connect to host failed";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar8);
  iVar5 = -1;
LAB_00168bda:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_858);
  if (local_810 != local_800) {
    operator_delete(local_810,local_800[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,
                    CONCAT71(local_7f0.field_2._M_allocated_capacity._1_7_,
                             local_7f0.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Rds::DescribeDBInstanceAttribute(const RdsDescribeDBInstanceAttributeRequestType& req,
                      RdsDescribeDBInstanceAttributeResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDBInstanceAttribute");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.client_token.empty()) {
    req_rpc->AddRequestQuery("ClientToken", req.client_token);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}